

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

void pnga_distribution(Integer g_a,Integer proc,Integer *lo,Integer *hi)

{
  short sVar1;
  short sVar2;
  long lVar3;
  long lVar4;
  long in_RCX;
  long in_RDX;
  long lVar5;
  long in_RSI;
  long in_RDI;
  int _ndim_4;
  int _i_4;
  int _itmp_1;
  int _offset;
  int _ndim_3;
  int _i_3;
  int _index_3 [7];
  int _ndim_2;
  int _i_2;
  int _itmp;
  int _ndim_1;
  int _i_1;
  int _index_2 [7];
  int _ndim;
  int _i;
  Integer _dimpos_1;
  Integer _dimstart_1;
  Integer _dim_1;
  Integer _index_1;
  Integer _d_1;
  Integer _nb_1;
  Integer _loc_1;
  Integer _dimpos;
  Integer _dimstart;
  Integer _dim;
  Integer _index;
  Integer _d;
  Integer _nb;
  Integer _loc;
  Integer nodesize;
  Integer node;
  char err_string_1 [256];
  char err_string [256];
  Integer old_grp;
  Integer lproc;
  Integer ga_handle;
  int local_32c;
  int local_328;
  int local_324;
  int local_31c;
  int local_318 [7];
  int local_2fc;
  int local_2f8;
  int local_2f4;
  int local_2f0;
  int local_2ec;
  int local_2e8 [11];
  int local_2bc;
  long local_2b0;
  long local_2a0;
  long local_298;
  long local_290;
  long local_278;
  long local_268;
  long local_260;
  long local_258;
  Integer local_248;
  Integer local_240;
  char local_238 [160];
  Integer in_stack_fffffffffffffe68;
  char *in_stack_fffffffffffffe70;
  char local_138 [264];
  C_Integer local_30;
  long local_28;
  long local_20;
  long local_18;
  long local_10;
  long local_8;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if ((in_RDI + 1000 < 0) || ((long)_max_global_array <= in_RDI + 1000)) {
    sprintf(local_138,"%s: INVALID ARRAY HANDLE","nga_distribution");
    pnga_error(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  }
  if (GA[local_8 + 1000].actv == 0) {
    sprintf(local_238,"%s: ARRAY NOT ACTIVE","nga_distribution");
    pnga_error(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  }
  local_28 = local_8 + 1000;
  local_30 = local_10;
  if (0 < GA[local_28].num_rstrctd) {
    local_30 = GA[local_28].rank_rstrctd[local_10];
  }
  if (GA[local_28].property == 1) {
    local_240 = pnga_cluster_proc_nodeid(0x1c02e1);
    local_248 = pnga_cluster_nprocs(0x1c02f6);
    local_30 = local_10 % local_248;
  }
  if (GA[local_28].distr_type == 0) {
    if (GA[local_28].num_rstrctd == 0) {
      lVar3 = (long)GA[local_28].ndim;
      local_278 = 0;
      local_258 = 1;
      for (local_260 = 0; local_260 < lVar3; local_260 = local_260 + 1) {
        local_258 = GA[local_28].nblock[local_260] * local_258;
      }
      if ((local_258 + -1 < local_30) || (local_30 < 0)) {
        for (local_260 = 0; local_260 < lVar3; local_260 = local_260 + 1) {
          *(undefined8 *)(local_18 + local_260 * 8) = 0;
          *(undefined8 *)(local_20 + local_260 * 8) = 0xffffffffffffffff;
        }
      }
      else {
        local_268 = local_30;
        for (local_260 = 0; local_260 < lVar3; local_260 = local_260 + 1) {
          lVar5 = local_268 % (long)GA[local_28].nblock[local_260];
          local_268 = local_268 / (long)GA[local_28].nblock[local_260];
          lVar4 = lVar5 + local_278;
          local_278 = GA[local_28].nblock[local_260] + local_278;
          *(C_Integer *)(local_18 + local_260 * 8) = GA[local_28].mapc[lVar4];
          if (lVar5 == GA[local_28].nblock[local_260] + -1) {
            *(C_Integer *)(local_20 + local_260 * 8) = GA[local_28].dims[local_260];
          }
          else {
            *(C_Integer *)(local_20 + local_260 * 8) = GA[local_28].mapc[lVar4 + 1] + -1;
          }
        }
      }
    }
    else if (local_30 < GA[local_28].num_rstrctd) {
      lVar3 = (long)GA[local_28].ndim;
      local_2b0 = 0;
      local_290 = 1;
      for (local_298 = 0; local_298 < lVar3; local_298 = local_298 + 1) {
        local_290 = GA[local_28].nblock[local_298] * local_290;
      }
      if ((local_290 + -1 < local_30) || (local_30 < 0)) {
        for (local_298 = 0; local_298 < lVar3; local_298 = local_298 + 1) {
          *(undefined8 *)(local_18 + local_298 * 8) = 0;
          *(undefined8 *)(local_20 + local_298 * 8) = 0xffffffffffffffff;
        }
      }
      else {
        local_2a0 = local_30;
        for (local_298 = 0; local_298 < lVar3; local_298 = local_298 + 1) {
          lVar5 = local_2a0 % (long)GA[local_28].nblock[local_298];
          local_2a0 = local_2a0 / (long)GA[local_28].nblock[local_298];
          lVar4 = lVar5 + local_2b0;
          local_2b0 = GA[local_28].nblock[local_298] + local_2b0;
          *(C_Integer *)(local_18 + local_298 * 8) = GA[local_28].mapc[lVar4];
          if (lVar5 == GA[local_28].nblock[local_298] + -1) {
            *(C_Integer *)(local_20 + local_298 * 8) = GA[local_28].dims[local_298];
          }
          else {
            *(C_Integer *)(local_20 + local_298 * 8) = GA[local_28].mapc[lVar4 + 1] + -1;
          }
        }
      }
    }
    else {
      sVar1 = GA[local_28].ndim;
      for (local_2bc = 0; local_2bc < sVar1; local_2bc = local_2bc + 1) {
        *(undefined8 *)(local_18 + (long)local_2bc * 8) = 0;
        *(undefined8 *)(local_20 + (long)local_2bc * 8) = 0xffffffffffffffff;
      }
    }
  }
  else {
    local_328 = (int)local_30;
    if (((GA[local_28].distr_type == 1) || (GA[local_28].distr_type == 2)) ||
       (GA[local_28].distr_type == 3)) {
      sVar1 = GA[local_28].ndim;
      local_2f0 = (int)sVar1;
      sVar2 = GA[local_28].ndim;
      local_2fc = (int)sVar2;
      local_2f4 = local_328;
      local_2e8[0] = (int)((long)local_328 % GA[local_28].num_blocks[0]);
      for (local_2f8 = 1; local_2f8 < sVar2; local_2f8 = local_2f8 + 1) {
        local_2f4 = (int)((long)(local_2f4 - local_2e8[local_2f8 + -1]) /
                         GA[local_28].num_blocks[local_2f8 + -1]);
        local_2e8[local_2f8] = (int)((long)local_2f4 % GA[local_28].num_blocks[local_2f8]);
      }
      for (local_2ec = 0; local_2ec < sVar1; local_2ec = local_2ec + 1) {
        *(long *)(local_18 + (long)local_2ec * 8) =
             (long)local_2e8[local_2ec] * GA[local_28].block_dims[local_2ec] + 1;
        *(long *)(local_20 + (long)local_2ec * 8) =
             (long)(local_2e8[local_2ec] + 1) * GA[local_28].block_dims[local_2ec];
        if (GA[local_28].dims[local_2ec] < *(long *)(local_20 + (long)local_2ec * 8)) {
          *(C_Integer *)(local_20 + (long)local_2ec * 8) = GA[local_28].dims[local_2ec];
        }
      }
    }
    else if (GA[local_28].distr_type == 4) {
      sVar1 = GA[local_28].ndim;
      local_324 = 0;
      sVar2 = GA[local_28].ndim;
      local_318[0] = (int)((long)local_328 % GA[local_28].num_blocks[0]);
      for (local_32c = 1; local_32c < sVar2; local_32c = local_32c + 1) {
        local_328 = (int)((long)(local_328 - local_318[local_32c + -1]) /
                         GA[local_28].num_blocks[local_32c + -1]);
        local_318[local_32c] = (int)((long)local_328 % GA[local_28].num_blocks[local_32c]);
      }
      for (local_31c = 0; local_31c < sVar1; local_31c = local_31c + 1) {
        *(C_Integer *)(local_18 + (long)local_31c * 8) =
             GA[local_28].mapc[local_324 + local_318[local_31c]];
        if ((long)local_318[local_31c] < GA[local_28].num_blocks[local_31c] + -1) {
          *(C_Integer *)(local_20 + (long)local_31c * 8) =
               GA[local_28].mapc[local_324 + local_318[local_31c] + 1] + -1;
        }
        else {
          *(C_Integer *)(local_20 + (long)local_31c * 8) = GA[local_28].dims[local_31c];
        }
        local_324 = local_324 + (int)GA[local_28].num_blocks[local_31c];
      }
    }
  }
  return;
}

Assistant:

void pnga_distribution(Integer g_a, Integer proc, Integer *lo, Integer * hi)
{
  Integer ga_handle, lproc, old_grp;

  ga_check_handleM(g_a, "nga_distribution");
  ga_handle = (GA_OFFSET + g_a);

  lproc = proc;
  if (GA[ga_handle].num_rstrctd > 0) {
    lproc = GA[ga_handle].rank_rstrctd[lproc];
  }
  /* This currently assumes that read-only property can only be applied to
   * processors on the world group */
  if (GA[ga_handle].property == READ_ONLY) {
    Integer node = pnga_cluster_proc_nodeid(proc);
    Integer nodesize = pnga_cluster_nprocs(node);
    lproc = proc%nodesize;
  }
  ga_ownsM(ga_handle, lproc, lo, hi);
}